

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_envelope.cxx
# Opt level: O1

void __thiscall xray_re::xr_envelope::load_1(xr_envelope *this,xr_reader *r)

{
  uint8_t *puVar1;
  uint *puVar2;
  pointer ppxVar3;
  xr_key *this_00;
  ulong __n;
  xr_key *local_38;
  
  puVar1 = (r->field_2).m_p;
  (r->field_2).m_p = puVar1 + 4;
  this->m_behaviour0 = *puVar1;
  puVar1 = (r->field_2).m_p;
  (r->field_2).m_p = puVar1 + 4;
  this->m_behaviour1 = *puVar1;
  puVar2 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
  __n = (ulong)*puVar2;
  std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>::reserve(&this->m_keys,__n);
  for (; __n != 0; __n = __n - 1) {
    local_38 = (xr_key *)0x0;
    std::vector<xray_re::xr_key*,std::allocator<xray_re::xr_key*>>::emplace_back<xray_re::xr_key*>
              ((vector<xray_re::xr_key*,std::allocator<xray_re::xr_key*>> *)&this->m_keys,&local_38)
    ;
    ppxVar3 = (this->m_keys).
              super__Vector_base<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    this_00 = (xr_key *)operator_new(0x28);
    xr_key::load_1(this_00,r);
    ppxVar3[-1] = this_00;
  }
  return;
}

Assistant:

void xr_envelope::load_1(xr_reader& r)
{
	m_behaviour0 = uint8_t(r.r_u32() & UINT8_MAX);
	m_behaviour1 = uint8_t(r.r_u32() & UINT8_MAX);
	r.r_seq(r.r_u32(), m_keys, xr_reader::f_r_new<xr_key>(&xr_key::load_1));
}